

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,AllocationPolicy *policy)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  uintptr_t uVar4;
  LogMessage local_b0;
  Voidify local_99;
  unsigned_long local_98;
  unsigned_long local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_69;
  unsigned_long local_68;
  uint local_5c;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_40;
  Voidify local_29;
  AllocationPolicy *local_28;
  void *p;
  uint64_t old_alloc_policy;
  AllocationPolicy *policy_local;
  ThreadSafeArena *this_local;
  
  old_alloc_policy = (uint64_t)policy;
  policy_local = (AllocationPolicy *)this;
  Init(this);
  bVar1 = AllocationPolicy::IsDefault((AllocationPolicy *)old_alloc_policy);
  if (!bVar1) {
    p = (void *)TaggedAllocationPolicyPtr::get_raw(&this->alloc_policy_);
    bVar1 = SerialArena::MaybeAllocateAligned(&this->first_arena_,0x20,&local_28);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                 ,0x27d);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    local_28->start_block_size = *(size_t *)old_alloc_policy;
    local_28->max_block_size = *(size_t *)(old_alloc_policy + 8);
    local_28->block_alloc = *(_func_void_ptr_size_t **)(old_alloc_policy + 0x10);
    local_28->block_dealloc = *(_func_void_void_ptr_size_t **)(old_alloc_policy + 0x18);
    local_5c = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_68 = absl::lts_20250127::log_internal::GetReferenceableValue((ulong)local_28 & 3);
    local_58 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_long>
                         (&local_5c,&local_68,"0u == reinterpret_cast<uintptr_t>(p) & 3");
    if (local_58 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                 ,0x282,pcVar3);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&absl_log_internal_check_op_result_1);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
    }
    TaggedAllocationPolicyPtr::set_policy(&this->alloc_policy_,local_28);
    if ((void *)0x3 < p) {
      local_90 = absl::lts_20250127::log_internal::GetReferenceableValue((ulong)p & 3);
      uVar4 = TaggedAllocationPolicyPtr::get_raw(&this->alloc_policy_);
      local_98 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar4 & 3);
      local_88 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                           (&local_90,&local_98,
                            "old_alloc_policy & 3 == alloc_policy_.get_raw() & 3");
      if (local_88 != (Nullable<const_char_*>)0x0) {
        pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                   ,0x284,pcVar3);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
    }
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(const AllocationPolicy& policy) {
  Init();

  if (policy.IsDefault()) return;

#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define ABSL_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)         \
  ABSL_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define ABSL_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  // We ensured enough space so this cannot fail.
  void* p;
  if (!first_arena_.MaybeAllocateAligned(kAllocPolicySize, &p)) {
    ABSL_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  ABSL_DCHECK_EQ(0u, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  ABSL_DCHECK_POLICY_FLAGS_();

#undef ABSL_DCHECK_POLICY_FLAGS_
}